

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

Float __thiscall pbrt::LanczosSincFilter::Integral(LanczosSincFilter *this)

{
  float fVar1;
  float fVar2;
  Tuple2<pbrt::Vector2,_float> TVar3;
  undefined1 auVar4 [16];
  int y;
  int iVar5;
  int x;
  int iVar6;
  undefined1 auVar7 [16];
  Float FVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar14 [16];
  undefined1 in_register_000012c4 [12];
  RNG rng;
  float local_7c;
  Tuple2<pbrt::Point2,_float> local_70;
  undefined1 local_68 [16];
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  RNG local_38;
  undefined1 extraout_var [60];
  
  fVar1 = (this->radius).super_Tuple2<pbrt::Vector2,_float>.x;
  fVar2 = (this->radius).super_Tuple2<pbrt::Vector2,_float>.y;
  local_38.state = 0x853c49e6748fea9b;
  local_38.inc = 0xda3e39cb94b95bdb;
  local_7c = 0.0;
  for (iVar5 = 0; iVar5 != 0x40; iVar5 = iVar5 + 1) {
    local_68._0_4_ = (undefined4)iVar5;
    local_68._4_12_ = in_ZMM1._4_12_;
    for (iVar6 = 0; iVar6 != 0x40; iVar6 = iVar6 + 1) {
      auVar9._0_4_ = (float)iVar6;
      auVar9._4_12_ = in_register_000012c4;
      _local_48 = vinsertps_avx(auVar9,ZEXT416((uint)local_68._0_4_),0x10);
      local_58 = RNG::Uniform<float>(&local_38);
      uStack_54 = extraout_XMM0_Db;
      uStack_50 = extraout_XMM0_Dc;
      uStack_4c = extraout_XMM0_Dd;
      auVar12._0_4_ = RNG::Uniform<float>(&local_38);
      auVar12._4_60_ = extraout_var;
      auVar7._4_4_ = uStack_54;
      auVar7._0_4_ = local_58;
      auVar7._8_4_ = uStack_50;
      auVar7._12_4_ = uStack_4c;
      auVar14._8_4_ = 0x3f800000;
      auVar14._0_8_ = 0x3f8000003f800000;
      auVar14._12_4_ = 0x3f800000;
      auVar4 = vinsertps_avx(auVar7,auVar12._0_16_,0x10);
      auVar10._0_4_ = auVar4._0_4_ + (float)local_48._0_4_;
      auVar10._4_4_ = auVar4._4_4_ + (float)local_48._4_4_;
      auVar10._8_4_ = auVar4._8_4_ + fStack_40;
      auVar10._12_4_ = auVar4._12_4_ + fStack_3c;
      TVar3 = (this->radius).super_Tuple2<pbrt::Vector2,_float>;
      auVar13._8_8_ = 0;
      auVar13._0_4_ = TVar3.x;
      auVar13._4_4_ = TVar3.y;
      auVar4._8_4_ = 0x3c800000;
      auVar4._0_8_ = 0x3c8000003c800000;
      auVar4._12_4_ = 0x3c800000;
      auVar7 = vmulps_avx512vl(auVar10,auVar4);
      auVar4 = vsubps_avx(auVar14,auVar7);
      auVar11._0_4_ = auVar7._0_4_ * TVar3.x;
      auVar11._4_4_ = auVar7._4_4_ * TVar3.y;
      auVar11._8_4_ = auVar7._8_4_ * 0.0;
      auVar11._12_4_ = auVar7._12_4_ * 0.0;
      auVar4 = vfnmadd231ps_fma(auVar11,auVar13,auVar4);
      local_70 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar4);
      FVar8 = Evaluate(this,(Point2f *)&local_70);
      local_7c = local_7c + FVar8;
      in_ZMM1 = ZEXT464((uint)local_7c);
    }
  }
  fVar1 = fVar1 + fVar1;
  return (fVar1 + fVar1) * fVar2 * local_7c * 0.00024414062;
}

Assistant:

Float LanczosSincFilter::Integral() const {
    Float sum = 0;
    int sqrtSamples = 64;
    int nSamples = sqrtSamples * sqrtSamples;
    Float area = 2 * radius.x * 2 * radius.y;
    RNG rng;
    for (int y = 0; y < sqrtSamples; ++y) {
        for (int x = 0; x < sqrtSamples; ++x) {
            Point2f u((x + rng.Uniform<Float>()) / sqrtSamples,
                      (y + rng.Uniform<Float>()) / sqrtSamples);
            Point2f p(Lerp(u.x, -radius.x, radius.x), Lerp(u.y, -radius.y, radius.y));
            sum += Evaluate(p);
        }
    }
    return sum / nSamples * area;
}